

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int BREFILL(p_ply ply)

{
  size_t sVar1;
  long in_RDI;
  size_t size;
  
  sVar1 = *(long *)(in_RDI + 0x2058) - *(long *)(in_RDI + 0x2048);
  memmove((void *)(in_RDI + 0x48),(void *)(in_RDI + 0x48 + *(long *)(in_RDI + 0x2048)),sVar1);
  *(size_t *)(in_RDI + 0x2058) = sVar1;
  *(undefined8 *)(in_RDI + 0x2050) = 0;
  *(undefined8 *)(in_RDI + 0x2048) = 0;
  sVar1 = fread((void *)(in_RDI + 0x48 + sVar1),1,0x1fff - sVar1,*(FILE **)(in_RDI + 0x38));
  *(size_t *)(in_RDI + 0x2058) = sVar1 + *(long *)(in_RDI + 0x2058);
  *(undefined1 *)(in_RDI + 0x48 + *(long *)(in_RDI + 0x2058)) = 0;
  return (int)(sVar1 != 0);
}

Assistant:

static int BREFILL(p_ply ply) {
    /* move untouched data to beginning of buffer */
    size_t size = BSIZE(ply);
    memmove(ply->buffer, BFIRST(ply), size);
    ply->buffer_last = size;
    ply->buffer_first = ply->buffer_token = 0;
    /* fill remaining with new data */
    size = fread(ply->buffer+size, 1, BUFFERSIZE-size-1, ply->fp);
    /* increase size to account for new data */
    ply->buffer_last += size;
    /* place sentinel so we can use str* functions with buffer */
    ply->buffer[ply->buffer_last] = '\0';
    /* check if read failed */
    return size > 0;
}